

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O2

void terminatetetgen(tetgenmesh *m,int x)

{
  char *__s;
  
  switch(x) {
  case 1:
    __s = "Error:  Out of memory.";
    break;
  case 2:
    puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
    puts("  the message above, your input data set, and the exact");
    __s = "  command line you used to run this program, thank you.";
    break;
  case 3:
    puts("A self-intersection was detected. Program stopped.");
    __s = "Hint: use -d option to detect all self-intersections.";
    break;
  case 4:
    puts("A very small input feature size was detected. Program stopped.");
    if (m != (tetgenmesh *)0x0) {
      printf("Hint: use -T option to set a smaller tolerance. Current is %g\n",m->b->epsilon);
    }
    goto switchD_001492c8_caseD_6;
  case 5:
    puts("Two very close input facets were detected. Program stopped.");
    __s = "Hint: use -Y option to avoid adding Steiner points in boundary.";
    break;
  default:
    goto switchD_001492c8_caseD_6;
  case 10:
    __s = "An input error was detected. Program stopped.";
  }
  puts(__s);
switchD_001492c8_caseD_6:
  exit(x);
}

Assistant:

inline void terminatetetgen(tetgenmesh *m, int x)
{
#ifdef TETLIBRARY
  throw x;
#else
  switch (x) {
  case 1: // Out of memory.
    printf("Error:  Out of memory.\n"); 
    break;
  case 2: // Encounter an internal error.
    printf("Please report this bug to Hang.Si@wias-berlin.de. Include\n");
    printf("  the message above, your input data set, and the exact\n");
    printf("  command line you used to run this program, thank you.\n");
    break;
  case 3:
    printf("A self-intersection was detected. Program stopped.\n");
    printf("Hint: use -d option to detect all self-intersections.\n"); 
    break;
  case 4:
    printf("A very small input feature size was detected. Program stopped.\n");
    if (m) {
      printf("Hint: use -T option to set a smaller tolerance. Current is %g\n",
             m->b->epsilon);
    }
    break;
  case 5:
    printf("Two very close input facets were detected. Program stopped.\n");
    printf("Hint: use -Y option to avoid adding Steiner points in boundary.\n");
    break;
  case 10: 
    printf("An input error was detected. Program stopped.\n"); 
    break;
  } // switch (x)
  exit(x);
#endif // #ifdef TETLIBRARY
}